

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QString * qv(QString *__return_storage_ptr__,ProString *val)

{
  long in_FS_OFFSET;
  QString local_58;
  QStringBuilder<char,_QString> local_40;
  QString *local_20;
  
  local_20 = *(QString **)(in_FS_OFFSET + 0x28);
  QMakeEvaluator::quoteValue(&local_58,val);
  local_40.b.d.size = local_58.d.size;
  local_40.b.d.ptr = local_58.d.ptr;
  local_40.b.d.d = local_58.d.d;
  local_40.a = ' ';
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QStringBuilder<char,_QString>::convertTo<QString>(__return_storage_ptr__,&local_40);
  if (&(local_40.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString
qv(const ProString &val)
{
    return ' ' + QMakeEvaluator::quoteValue(val);
}